

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doublingfactorcounter_test.cpp
# Opt level: O1

Utest * __thiscall
TEST_DoublingFactorCounterTest_ThreeColourStraights_TestShell::createTest
          (TEST_DoublingFactorCounterTest_ThreeColourStraights_TestShell *this)

{
  TEST_DoublingFactorCounterTest_ThreeColourStraights_Test *this_00;
  
  this_00 = (TEST_DoublingFactorCounterTest_ThreeColourStraights_Test *)
            operator_new(0xc0,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/doublingfactorcounter_test.cpp"
                         ,0xe1);
  TEST_DoublingFactorCounterTest_ThreeColourStraights_Test::
  TEST_DoublingFactorCounterTest_ThreeColourStraights_Test(this_00);
  return (Utest *)this_00;
}

Assistant:

TEST(DoublingFactorCounterTest, ThreeColourStraights)
{
	addPair(Tile::WestWind);
	addSequence(Tile::TwoOfCharacters, false);
	addSequence(Tile::TwoOfCircles, false);
	addSequence(Tile::TwoOfBamboos, false);
	addSequence(Tile::SevenOfCharacters, true);

	s.winByDiscard();
	auto r = c.report();

	CHECK_EQUAL(1, r.patterns.count(Pattern::ThreeColourStraights));
	CHECK_EQUAL(1, r.doubling_factor);
}